

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

bool CoreML::Specification::operator==
               (RepeatedPtrField<CoreML::Specification::SparseNode> *a,
               RepeatedPtrField<CoreML::Specification::SparseNode> *b)

{
  bool bVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  int iVar5;
  bool bVar6;
  
  iVar5 = (a->super_RepeatedPtrFieldBase).current_size_;
  if (iVar5 != (b->super_RepeatedPtrFieldBase).current_size_) {
    return false;
  }
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SparseNode>::TypeHandler>
                         (&a->super_RepeatedPtrFieldBase,iVar5);
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SparseNode>::TypeHandler>
                         (&b->super_RepeatedPtrFieldBase,iVar5);
      bVar6 = pTVar3->index_ == pTVar4->index_;
      bVar1 = pTVar3->value_ == pTVar4->value_;
      bVar2 = bVar1 && bVar6;
      if (!bVar1 || !bVar6) {
        return bVar2;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < (a->super_RepeatedPtrFieldBase).current_size_);
    return bVar2;
  }
  return true;
}

Assistant:

inline int RepeatedPtrFieldBase::size() const {
  return current_size_;
}